

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall QLayout::QLayout(QLayout *this,QLayoutPrivate *dd,QLayout *lay,QWidget *w)

{
  QLayoutPrivate *pQVar1;
  QLayout *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  QWidgetPrivate *pQVar6;
  QObject *in_RCX;
  QObject *in_RDX;
  QObjectPrivate *in_RSI;
  QLayout *in_RDI;
  long in_FS_OFFSET;
  QLayoutPrivate *d;
  char *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  int line;
  QLayoutItem *file;
  QObject *this_00;
  QString local_60;
  QString local_48;
  char local_30 [36];
  undefined1 local_c [4];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RCX;
  if (in_RDX != (QObject *)0x0) {
    this_00 = in_RDX;
  }
  QObject::QObject(&in_RDI->super_QObject,in_RSI,this_00);
  file = &in_RDI->super_QLayoutItem;
  memset(local_c,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x33be95);
  QLayoutItem::QLayoutItem
            ((QLayoutItem *)0x33bea6,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
             SUB84((ulong)in_stack_ffffffffffffff48 >> 0x20,0));
  *(undefined ***)in_RDI = &PTR_metaObject_00d07730;
  (in_RDI->super_QLayoutItem)._vptr_QLayoutItem = (_func_int **)&PTR__QLayout_00d07830;
  pQVar1 = d_func((QLayout *)0x33becf);
  if (in_RDX == (QObject *)0x0) {
    if (in_RCX != (QObject *)0x0) {
      pQVar2 = QWidget::layout((QWidget *)0x33bf0e);
      if (pQVar2 == (QLayout *)0x0) {
        pQVar1->field_0x8c = pQVar1->field_0x8c & 0xfe | 1;
        pQVar6 = QWidget::d_func((QWidget *)0x33bffc);
        pQVar6->layout = in_RDI;
        (**(code **)(*(long *)in_RDI + 0x70))();
      }
      else {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,(char *)file,line,in_stack_ffffffffffffff48);
        QObject::objectName();
        QtPrivate::asString(&local_48);
        uVar3 = QString::utf16();
        (*(code *)**(undefined8 **)in_RCX)();
        uVar4 = QMetaObject::className();
        QObject::objectName();
        QtPrivate::asString(&local_60);
        uVar5 = QString::utf16();
        QMessageLogger::warning
                  (local_30,
                   "QLayout: Attempting to add QLayout \"%ls\" to %s \"%ls\", which already has a layout"
                   ,uVar3,uVar4,uVar5);
        QString::~QString((QString *)0x33bfc1);
        QString::~QString((QString *)0x33bfcb);
        QObject::setParent(&in_RDI->super_QObject);
      }
    }
  }
  else {
    (**(code **)(*(long *)in_RDX + 0x80))(in_RDX,&in_RDI->super_QLayoutItem);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QLayout::QLayout(QLayoutPrivate &dd, QLayout *lay, QWidget *w)
    : QObject(dd, lay ? static_cast<QObject*>(lay) : static_cast<QObject*>(w))
{
    Q_D(QLayout);
    if (lay) {
        lay->addItem(this);
    } else if (w) {
        if (Q_UNLIKELY(w->layout())) {
            qWarning("QLayout: Attempting to add QLayout \"%ls\" to %s \"%ls\", which"
                     " already has a layout",
                     qUtf16Printable(QObject::objectName()), w->metaObject()->className(),
                     qUtf16Printable(w->objectName()));
            setParent(nullptr);
        } else {
            d->topLevel = true;
            w->d_func()->layout = this;
            QT_TRY {
                invalidate();
            } QT_CATCH(...) {
                w->d_func()->layout = nullptr;
                QT_RETHROW;
            }
        }
    }